

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O3

ptr<out_of_log_msg> __thiscall nuraft::out_of_log_msg::deserialize(out_of_log_msg *this,buffer *buf)

{
  undefined8 *puVar1;
  uint64_t uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<out_of_log_msg> pVar3;
  buffer_serializer bs;
  buffer_serializer bStack_38;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_001cf1d8;
  puVar1[2] = 0;
  this[1].start_idx_of_leader_ = (ulong)puVar1;
  this->start_idx_of_leader_ = (ulong)(puVar1 + 2);
  buffer_serializer::buffer_serializer(&bStack_38,buf,LITTLE);
  buffer_serializer::get_u8(&bStack_38);
  uVar2 = buffer_serializer::get_u64(&bStack_38);
  puVar1[2] = uVar2;
  pVar3.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<out_of_log_msg>)
         pVar3.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<out_of_log_msg> out_of_log_msg::deserialize(buffer& buf) {
    ptr<out_of_log_msg> ret = cs_new<out_of_log_msg>();

    buffer_serializer bs(buf);
    uint8_t version = bs.get_u8();
    (void)version;
    ret->start_idx_of_leader_ = bs.get_u64();
    return ret;
}